

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,float *inner,int numInner,
          float *outer,int numOuter)

{
  undefined4 in_register_0000000c;
  float *local_d0;
  string local_c8;
  _anonymous_namespace_ *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  long lStack_28;
  int numOuter_local;
  float *outer_local;
  _anonymous_namespace_ *p_Stack_18;
  int numInner_local;
  float *inner_local;
  
  lStack_28 = CONCAT44(in_register_0000000c,numInner);
  outer_local._4_4_ = (int)inner;
  local_2c = (int)outer;
  local_98 = this + (long)outer_local._4_4_ * 4;
  p_Stack_18 = this;
  inner_local = (float *)__return_storage_ptr__;
  elemsStr<float_const*>
            (&local_90,(Functional *)&stack0xffffffffffffffe8,(float **)&local_98,(float **)0x0,0,
             numOuter);
  std::operator+(&local_70,"inner: ",&local_90);
  std::operator+(&local_50,&local_70,", outer: ");
  local_d0 = (float *)(lStack_28 + (long)local_2c * 4);
  elemsStr<float_const*>
            (&local_c8,(Functional *)&stack0xffffffffffffffd8,&local_d0,(float **)0x0,0,numOuter);
  std::operator+(__return_storage_ptr__,&local_50,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

static string tessellationLevelsString (const float* inner, int numInner, const float* outer, int numOuter)
{
	DE_ASSERT(numInner >= 0 && numOuter >= 0);
	return "inner: " + elemsStr(inner, inner+numInner) + ", outer: " + elemsStr(outer, outer+numOuter);
}